

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAcesFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::AcesOutputFile::AcesOutputFile
          (AcesOutputFile *this,string *name,int width,int height,RgbaChannels rgbaChannels,
          float pixelAspectRatio,V2f *screenWindowCenter,float screenWindowWidth,LineOrder lineOrder
          ,Compression compression,int numThreads)

{
  Data *pDVar1;
  RgbaOutputFile *this_00;
  Header newHeader;
  
  this->_vptr_AcesOutputFile = (_func_int **)&PTR__AcesOutputFile_001e2bf8;
  pDVar1 = (Data *)operator_new(8);
  pDVar1->rgbaFile = (RgbaOutputFile *)0x0;
  this->_data = pDVar1;
  anon_unknown_14::checkCompression(compression);
  Header::Header(&newHeader,width,height,pixelAspectRatio,screenWindowCenter,screenWindowWidth,
                 lineOrder,compression);
  acesChromaticities();
  addChromaticities(&newHeader,&acesChromaticities::acesChr);
  acesChromaticities();
  addAdoptedNeutral(&newHeader,&acesChromaticities::acesChr.white);
  this_00 = (RgbaOutputFile *)operator_new(0x18);
  RgbaOutputFile::RgbaOutputFile
            (this_00,(name->_M_dataplus)._M_p,&newHeader,rgbaChannels,numThreads);
  this->_data->rgbaFile = this_00;
  RgbaOutputFile::setYCRounding(this_00,7,6);
  Header::~Header(&newHeader);
  return;
}

Assistant:

AcesOutputFile::AcesOutputFile (
    const std::string&         name,
    int                        width,
    int                        height,
    RgbaChannels               rgbaChannels,
    float                      pixelAspectRatio,
    const IMATH_NAMESPACE::V2f screenWindowCenter,
    float                      screenWindowWidth,
    LineOrder                  lineOrder,
    Compression                compression,
    int                        numThreads)
    : _data (new Data)
{
    checkCompression (compression);

    Header newHeader (
        width,
        height,
        pixelAspectRatio,
        screenWindowCenter,
        screenWindowWidth,
        lineOrder,
        compression);

    addChromaticities (newHeader, acesChromaticities ());
    addAdoptedNeutral (newHeader, acesChromaticities ().white);

    _data->rgbaFile =
        new RgbaOutputFile (name.c_str (), newHeader, rgbaChannels, numThreads);

    _data->rgbaFile->setYCRounding (7, 6);
}